

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestCoverageHandler::GetNextInt
          (cmCTestCoverageHandler *this,string *inputLine,size_type *pos,int *value)

{
  int iVar1;
  size_type sVar2;
  long *local_48 [2];
  long local_38 [2];
  
  sVar2 = std::__cxx11::string::find((char)inputLine,0x2c);
  *pos = sVar2;
  std::__cxx11::string::substr((ulong)local_48,(ulong)inputLine);
  iVar1 = atoi((char *)local_48[0]);
  *value = iVar1;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (*pos != 0xffffffffffffffff) {
    *pos = *pos + 1;
  }
  return true;
}

Assistant:

bool cmCTestCoverageHandler::GetNextInt(std::string const& inputLine,
                                        std::string::size_type& pos,
                                        int& value)
{
  std::string::size_type start = pos;
  pos = inputLine.find(',', start);
  value = atoi(inputLine.substr(start, pos).c_str());
  if (pos == std::string::npos) {
    return true;
  }
  pos++;
  return true;
}